

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::Configurations::setGlobally
          (Configurations *this,ConfigurationType configurationType,string *value,
          bool includeGlobalLevel)

{
  anon_class_32_4_9afad3aa local_68;
  function<bool_()> local_48;
  EnumType local_28;
  undefined1 local_21;
  EnumType lIndex;
  bool includeGlobalLevel_local;
  string *value_local;
  Configurations *pCStack_10;
  ConfigurationType configurationType_local;
  Configurations *this_local;
  
  local_21 = includeGlobalLevel;
  _lIndex = value;
  value_local._4_4_ = configurationType;
  pCStack_10 = this;
  if (includeGlobalLevel) {
    set(this,Global,configurationType,value);
  }
  local_28 = 2;
  local_68.configurationType = (ConfigurationType *)((long)&value_local + 4);
  local_68.value = _lIndex;
  local_68.this = this;
  local_68.lIndex = &local_28;
  std::function<bool()>::
  function<el::Configurations::setGlobally(el::ConfigurationType,std::__cxx11::string_const&,bool)::__0,void>
            ((function<bool()> *)&local_48,&local_68);
  LevelHelper::forEachLevel(&local_28,&local_48);
  el::base::utils::std::function<bool_()>::~function(&local_48);
  return;
}

Assistant:

void Configurations::setGlobally(ConfigurationType configurationType, const std::string& value,
                                 bool includeGlobalLevel) {
  if (includeGlobalLevel) {
    set(Level::Global, configurationType, value);
  }
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    set(LevelHelper::castFromInt(lIndex), configurationType, value);
    return false;  // Do not break lambda function yet as we need to set all levels regardless
  });
}